

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOptionCommand.cxx
# Opt level: O2

bool __thiscall
cmOptionCommand::InitialPass
          (cmOptionCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  string *psVar1;
  bool bVar2;
  CacheEntryType CVar3;
  char *pcVar4;
  cmState *this_01;
  ulong uVar5;
  string initialValue;
  allocator local_61;
  string local_60;
  string local_40;
  
  uVar5 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  this_00 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string
            ((string *)&local_60,"CMAKE_MINIMUM_REQUIRED_VERSION",(allocator *)&local_40);
  pcVar4 = cmMakefile::GetDefinition(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (pcVar4 == (char *)0x0) {
    if (uVar5 < 0x21) goto LAB_003ca1e8;
  }
  else if (0x60 < (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start) || uVar5 < 0x21) {
LAB_003ca1e8:
    std::__cxx11::string::string
              ((string *)&local_60,"called with incorrect number of arguments: ",
               (allocator *)&local_40);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_40,args," ");
    std::__cxx11::string::append((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    cmCommand::SetError(&this->super_cmCommand,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    return false;
  }
  std::__cxx11::string::string((string *)&local_60,"Off",(allocator *)&local_40);
  this_01 = cmMakefile::GetState((this->super_cmCommand).Makefile);
  pcVar4 = cmState::GetCacheEntryValue
                     (this_01,(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start);
  if (pcVar4 != (char *)0x0) {
    CVar3 = cmState::GetCacheEntryType
                      (this_01,(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (CVar3 != UNINITIALIZED) {
      psVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&local_40,"HELPSTRING",&local_61);
      cmState::SetCacheEntryProperty
                (this_01,psVar1,&local_40,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
      std::__cxx11::string::~string((string *)&local_40);
      goto LAB_003ca32f;
    }
    std::__cxx11::string::assign((char *)&local_60);
  }
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x60) {
    std::__cxx11::string::_M_assign((string *)&local_60);
  }
  bVar2 = cmSystemTools::IsOn(local_60._M_dataplus._M_p);
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar4 = "OFF";
  if (bVar2) {
    pcVar4 = "ON";
  }
  cmMakefile::AddCacheDefinition
            ((this->super_cmCommand).Makefile,psVar1,pcVar4,psVar1[1]._M_dataplus._M_p,BOOL,false);
LAB_003ca32f:
  std::__cxx11::string::~string((string *)&local_60);
  return true;
}

Assistant:

bool cmOptionCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  bool argError = false;
  if(args.size() < 2)
    {
    argError = true;
    }
  // for VTK 4.0 we have to support the option command with more than 3
  // arguments if CMAKE_MINIMUM_REQUIRED_VERSION is not defined, if
  // CMAKE_MINIMUM_REQUIRED_VERSION is defined, then we can have stricter
  // checking.
  if(this->Makefile->GetDefinition("CMAKE_MINIMUM_REQUIRED_VERSION"))
    {
    if(args.size() > 3)
      {
      argError = true;
      }
    }
  if(argError)
    {
    std::string m = "called with incorrect number of arguments: ";
    m += cmJoin(args, " ");
    this->SetError(m);
    return false;
    }

  std::string initialValue = "Off";
  // Now check and see if the value has been stored in the cache
  // already, if so use that value and don't look for the program
  cmState* state = this->Makefile->GetState();
  const char* existingValue = state->GetCacheEntryValue(args[0]);
  if(existingValue)
    {
    if (state->GetCacheEntryType(args[0]) != cmState::UNINITIALIZED)
      {
      state->SetCacheEntryProperty(args[0], "HELPSTRING", args[1]);
      return true;
      }
    initialValue = existingValue;
    }
  if(args.size() == 3)
    {
    initialValue = args[2];
    }
  bool init = cmSystemTools::IsOn(initialValue.c_str());
  this->Makefile->AddCacheDefinition(args[0], init? "ON":"OFF",
                                     args[1].c_str(), cmState::BOOL);
  return true;
}